

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_huff_decode(stbi__jpeg *j,stbi__huffman *h)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  int s;
  int k;
  int c;
  uint temp;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_4;
  
  if (*(int *)(in_RDI + 0x4824) < 0x10) {
    stbi__grow_buffer_unsafe
              ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  uVar2 = (uint)*(byte *)(in_RSI + (int)(*(uint *)(in_RDI + 0x4820) >> 0x17));
  if (uVar2 < 0xff) {
    bVar1 = *(byte *)(in_RSI + 0x500 + (long)(int)uVar2);
    if (*(int *)(in_RDI + 0x4824) < (int)(uint)bVar1) {
      local_4 = 0xffffffff;
    }
    else {
      *(int *)(in_RDI + 0x4820) = *(int *)(in_RDI + 0x4820) << (bVar1 & 0x1f);
      *(uint *)(in_RDI + 0x4824) = *(int *)(in_RDI + 0x4824) - (uint)bVar1;
      local_4 = (uint)*(byte *)(in_RSI + 0x400 + (long)(int)uVar2);
    }
  }
  else {
    local_24 = 10;
    while (*(uint *)(in_RSI + 0x604 + (long)local_24 * 4) <= *(uint *)(in_RDI + 0x4820) >> 0x10) {
      local_24 = local_24 + 1;
    }
    if (local_24 == 0x11) {
      *(int *)(in_RDI + 0x4824) = *(int *)(in_RDI + 0x4824) + -0x10;
      local_4 = 0xffffffff;
    }
    else if (*(int *)(in_RDI + 0x4824) < local_24) {
      local_4 = 0xffffffff;
    }
    else {
      iVar3 = (*(uint *)(in_RDI + 0x4820) >> (0x20 - (byte)local_24 & 0x1f) & stbi__bmask[local_24])
              + *(int *)(in_RSI + 0x64c + (long)local_24 * 4);
      if ((iVar3 < 0) || (0xff < iVar3)) {
        local_4 = 0xffffffff;
      }
      else {
        *(int *)(in_RDI + 0x4824) = *(int *)(in_RDI + 0x4824) - local_24;
        *(int *)(in_RDI + 0x4820) = *(int *)(in_RDI + 0x4820) << ((byte)local_24 & 0x1f);
        local_4 = (uint)*(byte *)(in_RSI + 0x400 + (long)iVar3);
      }
    }
  }
  return local_4;
}

Assistant:

stbi_inline static int stbi__jpeg_huff_decode(stbi__jpeg *j, stbi__huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      int s = h->size[k];
      if (s > j->code_bits)
         return -1;
      j->code_buffer <<= s;
      j->code_bits -= s;
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   temp = j->code_buffer >> 16;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (32 - k)) & stbi__bmask[k]) + h->delta[k];
   if(c < 0 || c >= 256) // symbol id out of bounds!
       return -1;
   STBI_ASSERT((((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   j->code_buffer <<= k;
   return h->values[c];
}